

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,SkelRoot *root,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  value_type *rel;
  value_type *pvVar3;
  uint indent_00;
  string *psVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t in_R9D;
  uint indent_01;
  stringstream ss;
  ListEditQual local_214;
  allocator local_20d;
  uint32_t local_20c;
  string local_208;
  pprint *local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_20c = indent;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)root & 0xffffffff),n);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_208);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0xc0),s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = ::std::operator<<(poVar2," SkelRoot \"");
  poVar2 = ::std::operator<<(poVar2,(string *)(this + 0xa0));
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  bVar1 = PrimMetas::authored((PrimMetas *)(this + 3000));
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)root & 0xffffffff),n_00);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_(&local_208,this + 3000,(PrimMeta *)(ulong)((int)root + 1),indent);
    ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)root & 0xffffffff),n_01);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  indent_01 = (int)root + 1;
  local_1e8 = (pprint *)((ulong)root & 0xffffffff);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)root & 0xffffffff),n_02);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1d8,"visibility",(allocator *)&local_214);
  print_typed_token_attr<tinyusdz::Visibility>
            (&local_208,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
             (this + 0x580),&local_1d8,indent_01);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1d8,"purpose",(allocator *)&local_214);
  print_typed_token_attr<tinyusdz::Purpose>
            (&local_208,(TypedAttributeWithFallback<tinyusdz::Purpose> *)(this + 0x348),&local_1d8,
             indent_01);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1d8,"extent",(allocator *)&local_214);
  indent_00 = indent_01;
  print_typed_attr<tinyusdz::Extent>
            (&local_208,(TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)(this + 0xd0),
             &local_1d8,indent_01);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  if (this[0x808] == (tinyusdz)0x1) {
    rel = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                    ((optional<tinyusdz::Relationship> *)(this + 0x808));
    pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(this + 0x808));
    local_214 = pvVar3->listOpQual;
    psVar4 = &local_1d8;
    ::std::__cxx11::string::string((string *)psVar4,"proxyPrim",&local_20d);
    anon_unknown_173::print_relationship
              (&local_208,rel,&local_214,SUB81(psVar4,0),(string *)(ulong)indent_01,in_R9D);
    indent_00 = (uint)psVar4;
    ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  print_xformOps_abi_cxx11_
            (&local_208,this,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)indent_01,
             indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  print_props(&local_208,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0xb88),indent_01);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  if ((char)local_20c != '\0') {
    pprint::Indent_abi_cxx11_(&local_208,local_1e8,n_03);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  psVar4 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar4;
}

Assistant:

std::string to_string(const SkelRoot &root, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(root.spec) << " SkelRoot \""
     << root.name << "\"\n";
  if (root.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(root.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_token_attr(root.visibility, "visibility", indent + 1);
  ss << print_typed_token_attr(root.purpose, "purpose", indent + 1);
  ss << print_typed_attr(root.extent, "extent", indent + 1);

  if (root.proxyPrim) {
    ss << print_relationship(root.proxyPrim.value(),
                             root.proxyPrim.value().get_listedit_qual(),
                             /* custom */ false, "proxyPrim", indent + 1);
  }

  // TODO
  // Skeleton id
  // ss << pprint::Indent(indent) << "skelroot.skeleton_id << "\n"

  ss << print_xformOps(root.xformOps, indent + 1);

  ss << print_props(root.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}